

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::doMLMGNodalProjection
          (Projection *this,int c_lev,int nlevel,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *sig,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhcc,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhnd,Real rel_tol,
          Real abs_tol,bool increment_gp,MultiFab *sync_resid_crse,MultiFab *sync_resid_fine,
          bool doing_initial_vortproj)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  pointer ppMVar2;
  MultiFab *pMVar3;
  BCRec *pBVar4;
  pointer pGVar5;
  pointer pBVar6;
  long lVar7;
  pointer pIVar8;
  undefined8 uVar9;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> dst;
  pointer pSVar10;
  pointer pBVar11;
  TimeCenter TVar12;
  AmrLevel *pAVar13;
  long lVar14;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a;
  long lVar15;
  long lVar16;
  undefined8 *puVar17;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  _Var18;
  BoxArray *pBVar19;
  undefined8 *puVar20;
  LinOpBCType LVar21;
  array<amrex::LinOpBCType,_3UL> *paVar22;
  size_type sVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  byte bVar27;
  Real time;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> rhcc_rebase;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> rhnd_rebase;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> sigma_rebase;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> mg_geom;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel_rebase;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi_rebase;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> mg_dmap;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> mg_grids;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> phi_test;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> vel_test;
  NodalProjector nodal_projector;
  allocator_type local_419;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_418;
  int local_3fc;
  array<amrex::LinOpBCType,_3UL> local_3f8;
  long local_3e8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_3e0;
  ulong local_3d8;
  Projection *local_3d0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_3c8;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> local_3a8;
  array<amrex::LinOpBCType,_3UL> local_388;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  local_378;
  __normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
  local_370;
  long local_368;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> local_360;
  LPInfo local_348;
  Real local_328;
  Real local_320;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_318;
  size_type local_310;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_2d8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_2c0;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_2a8;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_290;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> local_278;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> local_260;
  undefined1 local_248 [256];
  unique_ptr<amrex::MLNodeLaplacian,_std::default_delete<amrex::MLNodeLaplacian>_> local_148;
  unique_ptr<amrex::MLMG,_std::default_delete<amrex::MLMG>_> local_140;
  int local_120 [2];
  int local_118;
  undefined8 local_110 [9];
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  MultiFab *local_a8;
  MultiFab *local_a0;
  BoxArray local_98;
  
  bVar27 = 0;
  sVar23 = (size_type)nlevel;
  local_3e0 = vel;
  local_328 = rel_tol;
  local_320 = abs_tol;
  local_308 = phi;
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&local_260,sVar23,(allocator_type *)local_248);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::vector
            (&local_278,sVar23,(allocator_type *)local_248);
  ppMVar2 = (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar24 = (long)c_lev;
  if (ppMVar2 !=
      (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar3 = ppMVar2[lVar24];
    lVar14 = 0xc;
    switch((pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type)
    {
    case null:
    case coarsenRatio:
      break;
    default:
      lVar14 = 0x10;
    case indexType:
    case indexType_coarsenRatio:
      if (*(int *)((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          _vptr_FabArrayBase + lVar14) != 0) {
        amrex::Assert_host("rhcc[c_lev]->boxArray().ixType().cellCentered()",
                           "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/Projection.cpp"
                           ,0x990,(char *)0x0);
      }
    }
  }
  ppMVar2 = (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar2 ==
      (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00366853;
  pMVar3 = ppMVar2[lVar24];
  lVar14 = 0xc;
  switch((pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    goto switchD_0036682c_caseD_0;
  case indexType:
  case indexType_coarsenRatio:
    break;
  default:
    lVar14 = 0x10;
  }
  if (*(int *)((long)&(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                      _vptr_FabArrayBase + lVar14) != 7) {
switchD_0036682c_caseD_0:
    amrex::Assert_host("rhnd[c_lev]->boxArray().ixType().nodeCentered()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/IAMR/Source/Projection.cpp"
                       ,0x993,(char *)0x0);
  }
LAB_00366853:
  set_boundary_velocity(this,c_lev,nlevel,local_3e0,true);
  pBVar4 = this->phys_bc;
  pGVar5 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = lVar24 * 200;
  lVar16 = 0;
  do {
    paVar22 = &local_388;
    if (*(char *)((long)(pGVar5 + lVar24) + 0x51U + lVar16) == '\x01') {
      local_3f8._M_elems[lVar16] = Periodic;
      LVar21 = Periodic;
    }
    else if (doing_initial_vortproj) {
      local_3f8._M_elems[lVar16] = Dirichlet;
      LVar21 = Dirichlet;
    }
    else {
      iVar1 = pBVar4->bc[lVar16];
      LVar21 = (uint)(iVar1 == 1) * 4 + Neumann;
      if (iVar1 == 2) {
        LVar21 = Dirichlet;
      }
      local_388._M_elems[lVar16] = LVar21;
      iVar1 = pBVar4->bc[lVar16 + 3];
      paVar22 = &local_3f8;
      if (iVar1 == 1) {
        LVar21 = inflow;
      }
      else if (iVar1 == 2) {
        LVar21 = Dirichlet;
      }
      else {
        LVar21 = Neumann;
      }
    }
    paVar22->_M_elems[lVar16] = LVar21;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            (&local_360,sVar23,(allocator_type *)local_248);
  local_3e8 = lVar24;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_290,sVar23,(allocator_type *)local_248);
  local_318 = sig;
  local_310 = sVar23;
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            (&local_2a8,sVar23,(allocator_type *)local_248);
  local_3d8 = (ulong)(uint)nlevel;
  local_3fc = nlevel;
  local_3d0 = this;
  if (0 < nlevel) {
    local_2f8 = local_3e8 * 0x68;
    local_300 = local_3d8 * 0x68;
    lVar16 = 8;
    lVar15 = 0;
    lVar25 = 0;
    lVar24 = local_3e8;
    local_2f0 = lVar14;
    do {
      local_2e8 = lVar24;
      local_2e0 = lVar16;
      memcpy((void *)((long)((local_360.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     lVar25 + -8),
             (void *)((long)&((this->parent->super_AmrCore).super_AmrMesh.geom.
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys +
                     lVar25 + lVar14),200);
      pBVar11 = local_290.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar7 = local_2f8;
      pBVar6 = (this->parent->super_AmrCore).super_AmrMesh.grids.
               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar17 = (undefined8 *)((long)&pBVar6->m_bat + lVar15 + local_2f8);
      puVar20 = (undefined8 *)
                ((long)&((local_290.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar15);
      for (lVar24 = 9; lVar24 != 0; lVar24 = lVar24 + -1) {
        *puVar20 = *puVar17;
        puVar17 = puVar17 + (ulong)bVar27 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar27 * -2 + 1;
      }
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&pBVar6->m_ref + lVar15 + local_2f8 + 8U);
      this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&((local_290.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start)->m_ref).
                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi + lVar15);
      this_00[-1]._M_pi = __r[-1]._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_00,__r);
      lVar16 = local_2e0;
      lVar24 = local_2e8;
      lVar14 = local_2f0;
      this = local_3d0;
      this_00[1]._M_pi = __r[1]._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(pBVar11->m_simplified_list).
                         super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + lVar15),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&pBVar6->m_simplified_list + lVar15 + lVar7 + 8U));
      lVar7 = *(long *)(*(long *)&((this->LevelData).
                                   super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                   .
                                   super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar24]->state).
                                  super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                                  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                       + 200);
      *(undefined8 *)
       ((long)local_2a8.
              super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) =
           *(undefined8 *)(lVar7 + 0x70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((local_2a8.
                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar16),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar7 + 0x78));
      lVar25 = lVar25 + 200;
      lVar15 = lVar15 + 0x68;
      lVar24 = lVar24 + 1;
      lVar16 = lVar16 + 0x10;
    } while (local_300 != lVar15);
  }
  sVar23 = local_310;
  lVar24 = local_3e8;
  local_348.do_semicoarsening = false;
  local_348.agg_grid_size = -1;
  local_348.con_grid_size = -1;
  local_348.has_metric_term = true;
  local_348.max_coarsening_level = 0x1e;
  local_348.max_semicoarsening_level = 0;
  local_348.semicoarsening_direction = -1;
  local_348.hidden_direction = -1;
  if (-1 < (int)(anonymous_namespace)::max_coarsening_level) {
    local_348.max_semicoarsening_level = 0;
    local_348.max_coarsening_level = (anonymous_namespace)::max_coarsening_level;
  }
  local_348.do_consolidation = (bool)(anonymous_namespace)::consolidation;
  local_348.do_agglomeration = (bool)(anonymous_namespace)::agglomeration;
  _Var18._M_current =
       (local_308->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_start + local_3e8;
  std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
  vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
            ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&local_2c0,_Var18,
             (__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
              )(_Var18._M_current + local_310),(allocator_type *)local_248);
  _Var18._M_current =
       (local_3e0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_start + lVar24;
  std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
  vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
            ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&local_2d8,_Var18,
             (__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
              )(_Var18._M_current + sVar23),(allocator_type *)local_248);
  _Var18._M_current =
       (local_318->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
       super__Vector_impl_data._M_start + lVar24;
  std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
  vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
            ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&local_378,_Var18,
             (__normal_iterator<amrex::MultiFab_*const_*,_std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>_>
              )(_Var18._M_current + sVar23),(allocator_type *)local_248);
  local_3a8.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
  super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppMVar2 = (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar2 !=
      (rhnd->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppMVar2 = ppMVar2 + lVar24;
    std::vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>>
              ((vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>> *)&local_3a8,
               ppMVar2,ppMVar2 + sVar23);
  }
  ppMVar2 = (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppMVar2 !=
      (rhcc->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppMVar2 = ppMVar2 + lVar24;
    std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>>
              ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&local_3c8,ppMVar2,
               ppMVar2 + sVar23);
  }
  std::vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>>::
  vector<__gnu_cxx::__normal_iterator<amrex::MultiFab*const*,std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>>,void>
            ((vector<amrex::MultiFab_const*,std::allocator<amrex::MultiFab_const*>> *)&local_418,
             local_378,local_370,&local_419);
  Hydro::NodalProjector::NodalProjector
            ((NodalProjector *)local_248,&local_2d8,
             (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&local_418
             ,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&local_360,&local_348,
             &local_3c8,&local_3a8);
  if (local_418.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_418.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_418.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Hydro::NodalProjector::setDomainBC((NodalProjector *)local_248,local_388,local_3f8);
  *(undefined1 *)
   ((long)local_148._M_t.
          super___uniq_ptr_impl<amrex::MLNodeLaplacian,_std::default_delete<amrex::MLNodeLaplacian>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::MLNodeLaplacian_*,_std::default_delete<amrex::MLNodeLaplacian>_>
          .super__Head_base<0UL,_amrex::MLNodeLaplacian_*,_false>._M_head_impl + 0x640) =
       (anonymous_namespace)::use_gauss_seidel;
  *(undefined1 *)
   ((long)local_148._M_t.
          super___uniq_ptr_impl<amrex::MLNodeLaplacian,_std::default_delete<amrex::MLNodeLaplacian>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::MLNodeLaplacian_*,_std::default_delete<amrex::MLNodeLaplacian>_>
          .super__Head_base<0UL,_amrex::MLNodeLaplacian_*,_false>._M_head_impl + 0x641) =
       (anonymous_namespace)::use_harmonic_average;
  *(int *)((long)local_140._M_t.
                 super___uniq_ptr_impl<amrex::MLMG,_std::default_delete<amrex::MLMG>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MLMG_*,_std::default_delete<amrex::MLMG>_>.
                 super__Head_base<0UL,_amrex::MLMG_*,_false>._M_head_impl + 0x1c) =
       (anonymous_namespace)::max_fmg_iter;
  if (sync_resid_fine != (MultiFab *)0x0) {
    local_a0 = sync_resid_fine;
  }
  if (sync_resid_crse != (MultiFab *)0x0) {
    pIVar8 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = *(undefined8 *)pIVar8[lVar24].vect;
    iVar1 = *(int *)((long)(pIVar8 + lVar24) + 8);
    amrex::BoxArray::BoxArray
              (&local_98,
               (this->parent->super_AmrCore).super_AmrMesh.grids.
               super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
               super__Vector_impl_data._M_start + lVar24 + 1);
    local_a8 = sync_resid_crse;
    pBVar19 = &local_98;
    puVar17 = local_110;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar17 = *(undefined8 *)&pBVar19->m_bat;
      pBVar19 = (BoxArray *)((long)pBVar19 + (ulong)bVar27 * -0x10 + 8);
      puVar17 = puVar17 + (ulong)bVar27 * -2 + 1;
    }
    local_c8 = local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_120 = (int  [2])uVar9;
    local_118 = iVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_c0,
               &local_98.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_b8 = local_98.m_simplified_list.
               super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_b0,
               &local_98.m_simplified_list.
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    amrex::BoxArray::~BoxArray(&local_98);
  }
  Hydro::NodalProjector::project((NodalProjector *)local_248,&local_2c0,local_328,local_320);
  amrex::GetVecOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
            (&local_418,(amrex *)(local_248 + 0x50),a);
  if (0 < local_3fc) {
    uVar26 = 0;
    do {
      pAVar13 = (this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar24 + uVar26];
      if (pAVar13 == (AmrLevel *)0x0) {
        pAVar13 = (AmrLevel *)0x0;
      }
      else {
        pAVar13 = (AmrLevel *)
                  __dynamic_cast(pAVar13,&amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
      }
      dst.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (pAVar13->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start[2].new_data._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      if (increment_gp) {
        amrex::MultiFab::Add
                  ((MultiFab *)
                   dst.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   local_418.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar26],0,0,3,0);
      }
      else {
        amrex::MultiFab::Copy
                  ((MultiFab *)
                   dst.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   local_418.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar26],0,0,3,0);
      }
      pSVar10 = (pAVar13->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                super__Vector_impl_data._M_start;
      TVar12 = amrex::StateDescriptor::timeType(pSVar10[2].desc);
      if (TVar12 == Point) {
        time = pSVar10[2].new_time.stop;
      }
      else {
        time = (pSVar10[2].new_time.start + pSVar10[2].new_time.stop) * 0.5;
      }
      amrex::AmrLevel::FillPatch
                (pAVar13,(MultiFab *)
                         dst.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                 ((IntVect *)
                 ((long)dst.
                        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect
                 [0],time,2,0,3,0);
      uVar26 = uVar26 + 1;
      this = local_3d0;
    } while (local_3d8 != uVar26);
  }
  if (local_418.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_418.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_418.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Hydro::NodalProjector::~NodalProjector((NodalProjector *)local_248);
  if (local_3c8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c8.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a8.super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
      super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3a8.
                    super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>.
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a8.
                          super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          .
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.
                          super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          .
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_378._M_current != (MultiFab **)0x0) {
    operator_delete(local_378._M_current,local_368 - (long)local_378._M_current);
  }
  if (local_2d8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2d8.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c0.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c0.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c0.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            (&local_2a8);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_290);
  if (local_360.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_360.super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_360.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_360.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_278);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_260);
  return;
}

Assistant:

void Projection::doMLMGNodalProjection (int c_lev, int nlevel,
                                        const Vector<MultiFab*>& vel,
                                        const Vector<MultiFab*>& phi,
                                        const Vector<MultiFab*>& sig,
                                        const Vector<MultiFab*>& rhcc,
                                        const Vector<MultiFab*>& rhnd,
                                        Real rel_tol, Real abs_tol,
                                        bool increment_gp,
                                        MultiFab* sync_resid_crse,
                                        MultiFab* sync_resid_fine,
                                        bool doing_initial_vortproj)
{
    BL_PROFILE("Projection:::doMLMGNodalProjection()");

    int f_lev = c_lev + nlevel - 1;

    Vector<MultiFab> vel_test(nlevel);
    Vector<MultiFab> phi_test(nlevel);

    AMREX_ASSERT(vel[c_lev]->nGrow() >= 1);
    AMREX_ASSERT(vel[f_lev]->nGrow() >= 1);
    AMREX_ASSERT(phi[c_lev]->nGrow() == 1);
    AMREX_ASSERT(phi[f_lev]->nGrow() == 1);
    // MLMG does not copy any ghost cells from sig, rhcc or rhnd; fills ghost cells internally
    // AMREX_ASSERT(sig[c_lev]->nGrow() == 1);
    // AMREX_ASSERT(sig[f_lev]->nGrow() == 1);

    AMREX_ASSERT(sig[c_lev]->nComp() == 1);
    AMREX_ASSERT(sig[f_lev]->nComp() == 1);

    if (sync_resid_crse != 0) {
        AMREX_ASSERT(nlevel == 1);
        AMREX_ASSERT(c_lev < parent->finestLevel());
    }

    if (sync_resid_fine != 0) {
        AMREX_ASSERT((nlevel == 1 || nlevel == 2));
        AMREX_ASSERT(c_lev > 0);
    }

    if (!rhcc.empty() )
        AMREX_ALWAYS_ASSERT(rhcc[c_lev]->boxArray().ixType().cellCentered());

    if (!rhnd.empty() )
        AMREX_ALWAYS_ASSERT(rhnd[c_lev]->boxArray().ixType().nodeCentered());

    set_boundary_velocity(c_lev, nlevel, vel, true);

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        if (parent->Geom(c_lev).isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else if (doing_initial_vortproj)
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Dirichlet;
        }
        else
        {
            if (phys_bc->lo(idim) == Outflow) {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            } else if (phys_bc->lo(idim) == Inflow) {
                mlmg_lobc[idim] = LinOpBCType::inflow;
            } else {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }

            if (phys_bc->hi(idim) == Outflow) {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            } else if (phys_bc->hi(idim) == Inflow) {
                mlmg_hibc[idim] = LinOpBCType::inflow;
            } else {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
        }
    }

    //
    // Setup objects for projection
    //
    Vector<Geometry>            mg_geom(nlevel);
    Vector<BoxArray>            mg_grids(nlevel);
    Vector<DistributionMapping> mg_dmap(nlevel);

    for (int lev(0); lev < nlevel; lev++)
    {
        mg_geom[lev] = parent->Geom(lev+c_lev);
        mg_grids[lev] = parent->boxArray(lev+c_lev);
        mg_dmap[lev] = LevelData[lev+c_lev]->get_new_data(State_Type).DistributionMap();
    }

    // Setup infos to pass to linear operator
    LPInfo info;

    if (max_coarsening_level >= 0 ) {
	info.setMaxCoarseningLevel(max_coarsening_level);
    }
    info.setAgglomeration(agglomeration);
    info.setConsolidation(consolidation);
    // metric term stuff doesn't get used at all for nodal
    //info.setMetricTerm(false);

    //
    // Setup variables to use in projection
    //
    Vector<MultiFab*> phi_rebase(phi.begin()+c_lev, phi.begin()+c_lev+nlevel);
    Vector<MultiFab*> vel_rebase{vel.begin()+c_lev, vel.begin()+c_lev+nlevel};
    Vector<MultiFab*> sigma_rebase(sig.begin()+c_lev, sig.begin()+c_lev+nlevel);

    Vector<const MultiFab*> rhnd_rebase;
    Vector<MultiFab*> rhcc_rebase;

    if (!rhnd.empty())
    {
        rhnd_rebase.assign(rhnd.begin()+c_lev, rhnd.begin()+c_lev+nlevel);
    }

    if (!rhcc.empty())
    {
        rhcc_rebase.assign(rhcc.begin()+c_lev, rhcc.begin()+c_lev+nlevel);
    }

    // Setup nodal projector object
    Hydro::NodalProjector nodal_projector(vel_rebase, GetVecOfConstPtrs(sigma_rebase), mg_geom, info, rhcc_rebase, rhnd_rebase);
    nodal_projector.setDomainBC(mlmg_lobc, mlmg_hibc);

// WARNING: we set the strategy to Sigma to get exactly the same results as the no EB code
// when we don't have interior geometry
//  nodal_projector.getLinOp().setCoarseningStrategy(MLNodeLaplacian::CoarseningStrategy::Sigma);

    // MLNodeLaplacian.define() will set is_rz based on geom.

    nodal_projector.getLinOp().setGaussSeidel(use_gauss_seidel);
    nodal_projector.getLinOp().setHarmonicAverage(use_harmonic_average);
    nodal_projector.getMLMG().setMaxFmgIter(max_fmg_iter);

    if (sync_resid_fine != 0)
    {
        nodal_projector.setSyncResidualFine(sync_resid_fine);
    }
    if (sync_resid_crse != 0)
    {
        nodal_projector.setSyncResidualCrse(sync_resid_crse, parent->refRatio(c_lev), parent->boxArray(c_lev+1));
    }

    //
    // Project to get new P and update velocity
    //
    nodal_projector.project(phi_rebase,rel_tol,abs_tol);

    //
    // Update gradP
    //
    const auto gradphi = nodal_projector.getGradPhi();

    for (int lev = 0; lev < nlevel; lev++)
    {
      NavierStokesBase& ns = *dynamic_cast<NavierStokesBase*>(LevelData[lev+c_lev]);
      MultiFab& Gp = ns.get_new_data(Gradp_Type);

      if ( increment_gp )
      {
	//
	// Add a correction to Gradp
	//
        MultiFab::Add(Gp, *gradphi[lev], 0, 0, AMREX_SPACEDIM, 0);
      }
      else
      {
	//
	// Replace Gradp with the gradient(P) computed in MLMG
	//
	MultiFab::Copy(Gp, *gradphi[lev], 0, 0, AMREX_SPACEDIM, 0);

      }
      //
      // FIXME - could we get away with only FillPatching in predict_velocity
      // and initialPressureProject? I think this would depend on the definition
      // of properly nested... For now, be safe and just fill them.
      // Fill ghost cells
      //
      const Real& time = (ns.state)[Gradp_Type].curTime();
      NavierStokesBase::FillPatch(ns, Gp, Gp.nGrow(), time, Gradp_Type, 0, AMREX_SPACEDIM);
    }
}